

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O2

promoted_t<double> Omega_h::get_sum<double>(Read<double> *a)

{
  Alloc *pAVar1;
  ulong uVar2;
  long lVar3;
  promoted_t<double> pVar4;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  entering_parallel = 0;
  pVar4 = 0.0;
  for (lVar3 = 0; (long)(int)(uVar2 >> 3) * 8 != lVar3; lVar3 = lVar3 + 8) {
    pVar4 = pVar4 + *(double *)((long)(a->write_).shared_alloc_.direct_ptr + lVar3);
  }
  return pVar4;
}

Assistant:

const noexcept {
#ifndef __CUDA_ARCH__
    if (!(reinterpret_cast<std::uintptr_t>(alloc) & IN_PARALLEL)) {
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wnull-dereference"
#endif
      return alloc->size;
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic pop
#endif
    }
#endif
    return reinterpret_cast<std::uintptr_t>(alloc) >> 3;
  }